

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STPathSet.h
# Opt level: O2

void __thiscall
jbcoin::STPathElement::STPathElement
          (STPathElement *this,AccountID *account,Currency *currency,AccountID *issuer,
          bool forceCurrency)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  undefined8 uVar4;
  bool bVar5;
  size_t sVar6;
  
  this->mType = 0;
  (this->mAccountID).pn[4] = account->pn[4];
  uVar4 = *(undefined8 *)(account->pn + 2);
  *(undefined8 *)(this->mAccountID).pn = *(undefined8 *)account->pn;
  *(undefined8 *)((this->mAccountID).pn + 2) = uVar4;
  uVar4 = *(undefined8 *)(currency->pn + 2);
  *(undefined8 *)(this->mCurrencyID).pn = *(undefined8 *)currency->pn;
  *(undefined8 *)((this->mCurrencyID).pn + 2) = uVar4;
  (this->mCurrencyID).pn[4] = currency->pn[4];
  uVar1 = issuer->pn[1];
  uVar2 = issuer->pn[2];
  uVar3 = issuer->pn[3];
  (this->mIssuerID).pn[0] = issuer->pn[0];
  (this->mIssuerID).pn[1] = uVar1;
  (this->mIssuerID).pn[2] = uVar2;
  (this->mIssuerID).pn[3] = uVar3;
  (this->mIssuerID).pn[4] = issuer->pn[4];
  bVar5 = beast::operator==(&this->mAccountID);
  this->is_offer_ = bVar5;
  if (!bVar5) {
    *(byte *)&this->mType = (byte)this->mType | 1;
  }
  if (!forceCurrency) {
    bVar5 = beast::operator==(currency);
    if (bVar5) goto LAB_0020489c;
  }
  *(byte *)&this->mType = (byte)this->mType | 0x10;
LAB_0020489c:
  bVar5 = beast::operator==(issuer);
  if (!bVar5) {
    *(byte *)&this->mType = (byte)this->mType | 0x20;
  }
  sVar6 = get_hash(this);
  this->hash_value_ = sVar6;
  return;
}

Assistant:

STPathElement (
        AccountID const& account, Currency const& currency,
        AccountID const& issuer, bool forceCurrency = false)
        : mType (typeNone), mAccountID (account), mCurrencyID (currency)
        , mIssuerID (issuer), is_offer_ (isXRP(mAccountID))
    {
        if (!is_offer_)
            mType |= typeAccount;

        if (forceCurrency || !isXRP(currency))
            mType |= typeCurrency;

        if (!isXRP(issuer))
            mType |= typeIssuer;

        hash_value_ = get_hash (*this);
    }